

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenTable(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  EnumVal *ev;
  Namespace *ns;
  StructDef *pSVar1;
  pointer ppFVar2;
  pointer ppEVar3;
  FieldDef *pFVar4;
  pointer ppFVar5;
  FieldDef **field;
  string nfn;
  string local_588;
  allocator<char> local_561;
  IDLOptions *local_560;
  StructDef *local_558;
  pointer local_550;
  EnumDef *local_548;
  string local_540;
  pointer local_520;
  pointer local_518;
  string local_510;
  string local_4f0;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  string local_490;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    GenNativeTable(this,struct_def);
  }
  GenComment(this,&(struct_def->super_Definition).doc_comment,"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nfn,"STRUCT_NAME",(allocator<char> *)&local_540);
  EscapeKeyword(&local_588,this,(string *)struct_def);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&nfn,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&nfn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "struct {{STRUCT_NAME}} FLATBUFFERS_FINAL_CLASS : private ::flatbuffers::Table {",
             (allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"  typedef {{NATIVE_NAME}} NativeTableType;",
               (allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"  typedef {{STRUCT_NAME}}Builder Builder;",
             (allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  GenBinarySchemaTypeDef(this,((this->super_BaseGenerator).parser_)->root_struct_def_);
  if (1 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"  struct Traits;",(allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,
               "  static const ::flatbuffers::TypeTable *MiniReflectTypeTable() {",
               (allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"    return {{STRUCT_NAME}}TypeTable();",(allocator<char> *)&nfn
              );
    CodeWriter::operator+=(this_00,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"  }",(allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
  }
  EscapeKeyword(&nfn,this,(string *)struct_def);
  GenFullyQualifiedNameGetter(this,struct_def,&nfn);
  std::__cxx11::string::~string((string *)&nfn);
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar5 = ppFVar2;
  local_558 = struct_def;
  if (ppFVar2 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nfn,"SEP",(allocator<char> *)&local_540);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"",(allocator<char> *)&local_510);
    CodeWriter::SetValue(this_00,&nfn,&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&nfn);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "  enum FlatBuffersVTableOffset FLATBUFFERS_VTABLE_UNDERLYING_TYPE {",
               (allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    ppFVar5 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar2 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar5;
        ppFVar2 = ppFVar2 + 1) {
      if ((*ppFVar2)->deprecated == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nfn,"OFFSET_NAME",(allocator<char> *)&local_540);
        GenFieldOffsetName_abi_cxx11_(&local_588,this,*ppFVar2);
        CodeWriter::SetValue(this_00,&nfn,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&nfn);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nfn,"OFFSET_VALUE",(allocator<char> *)&local_540);
        NumToString<unsigned_short>(&local_588,((*ppFVar2)->value).offset);
        CodeWriter::SetValue(this_00,&nfn,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&nfn);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"{{SEP}}    {{OFFSET_NAME}} = {{OFFSET_VALUE}}\\",
                   (allocator<char> *)&nfn);
        CodeWriter::operator+=(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nfn,"SEP",(allocator<char> *)&local_540);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,",\n",(allocator<char> *)&local_510);
        CodeWriter::SetValue(this_00,&nfn,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&nfn);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"",(allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_350);
    pSVar1 = local_558;
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"  };",(allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    ppFVar2 = (pSVar1->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (pSVar1->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  local_560 = &(this->opts_).super_IDLOptions;
  for (; pSVar1 = local_558, ppFVar2 != ppFVar5; ppFVar2 = ppFVar2 + 1) {
    if ((*ppFVar2)->deprecated == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nfn,"FIELD_NAME",(allocator<char> *)&local_540);
      Name_abi_cxx11_(&local_588,this,*ppFVar2);
      CodeWriter::SetValue(this_00,&nfn,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&nfn);
      GenTableFieldGetter(this,*ppFVar2);
      if ((this->opts_).super_IDLOptions.mutable_buffer == true) {
        GenTableFieldSetter(this,*ppFVar2);
      }
      GetNestedFlatBufferName_abi_cxx11_(&nfn,this,*ppFVar2);
      if (nfn._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,"CPP_NAME",(allocator<char> *)&local_540);
        CodeWriter::SetValue(this_00,&local_588,&nfn);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"  const {{CPP_NAME}} *{{FIELD_NAME}}_nested_root() const {",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"    const auto _f = {{FIELD_NAME}}();",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,
                   "    return _f ? ::flatbuffers::GetRoot<{{CPP_NAME}}>(_f->Data())",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"              : nullptr;",(allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"  }",(allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      pFVar4 = *ppFVar2;
      if (pFVar4->flexbuffer == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,
                   "  flexbuffers::Reference {{FIELD_NAME}}_flexbuffer_root() const {",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"    const auto _f = {{FIELD_NAME}}();",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,
                   "    return _f ? flexbuffers::GetRoot(_f->Data(), _f->size())",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"              : flexbuffers::Reference();",
                   (allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"  }",(allocator<char> *)&local_588);
        CodeWriter::operator+=(this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        pFVar4 = *ppFVar2;
      }
      if (pFVar4->key == true) {
        GenKeyFieldMethods(this,pFVar4);
      }
      std::__cxx11::string::~string((string *)&nfn);
    }
  }
  if ((this->opts_).super_IDLOptions.cpp_static_reflection != false) {
    GenIndexBasedFieldGetter(this,local_558);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"  bool Verify(::flatbuffers::Verifier &verifier) const {",
             (allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"    return VerifyTableStart(verifier)\\",(allocator<char> *)&nfn)
  ;
  CodeWriter::operator+=(this_00,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  ppFVar5 = (pSVar1->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (pSVar1->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar5;
      ppFVar2 = ppFVar2 + 1) {
    if ((*ppFVar2)->deprecated == false) {
      GenVerifyCall(this,*ppFVar2," &&\n           ");
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0," &&\n           verifier.EndTable();",(allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"  }",(allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    TableUnPackSignature_abi_cxx11_(&local_588,this,pSVar1,true,local_560);
    std::operator+(&nfn,"  ",&local_588);
    std::operator+(&local_410,&nfn,";");
    CodeWriter::operator+=(this_00,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&nfn);
    std::__cxx11::string::~string((string *)&local_588);
    TableUnPackToSignature_abi_cxx11_(&local_588,this,pSVar1,true,local_560);
    std::operator+(&nfn,"  ",&local_588);
    std::operator+(&local_430,&nfn,";");
    CodeWriter::operator+=(this_00,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&nfn);
    std::__cxx11::string::~string((string *)&local_588);
    TablePackSignature_abi_cxx11_(&local_588,this,pSVar1,true,local_560);
    std::operator+(&nfn,"  ",&local_588);
    std::operator+(&local_450,&nfn,";");
    CodeWriter::operator+=(this_00,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&nfn);
    std::__cxx11::string::~string((string *)&local_588);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"};",(allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"",(allocator<char> *)&nfn);
  CodeWriter::operator+=(this_00,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  local_520 = (pSVar1->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  ppFVar2 = (pSVar1->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while (pSVar1 = local_558, ppFVar2 != local_520) {
    pFVar4 = *ppFVar2;
    local_550 = ppFVar2;
    if (((pFVar4->deprecated == false) && ((pFVar4->value).type.base_type == BASE_TYPE_UNION)) &&
       (local_548 = (pFVar4->value).type.enum_def, local_548->uses_multiple_type_instances == false)
       ) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nfn,"FIELD_NAME",(allocator<char> *)&local_540);
      Name_abi_cxx11_(&local_588,this,*local_550);
      CodeWriter::SetValue(this_00,&nfn,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&nfn);
      for (ppEVar3 = (local_548->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppEVar3 !=
          (local_548->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
        ev = *ppEVar3;
        if ((ev->union_type).base_type != BASE_TYPE_NONE) {
          local_518 = ppEVar3;
          GetUnionElement_abi_cxx11_(&nfn,this,ev,false,local_560);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_588,"U_ELEMENT_TYPE",(allocator<char> *)&local_4f0);
          ns = (local_548->super_Definition).defined_namespace;
          GetEnumValUse_abi_cxx11_(&local_510,this,local_548,ev);
          BaseGenerator::WrapInNameSpace(&local_540,&this->super_BaseGenerator,ns,&local_510);
          CodeWriter::SetValue(this_00,&local_588,&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_588,"U_FIELD_TYPE",(allocator<char> *)&local_4f0);
          std::operator+(&local_510,"const ",&nfn);
          std::operator+(&local_540,&local_510," *");
          CodeWriter::SetValue(this_00,&local_588,&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_588,"U_ELEMENT_NAME",(allocator<char> *)&local_540);
          CodeWriter::SetValue(this_00,&local_588,&nfn);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_588,"U_FIELD_NAME",&local_561);
          Name_abi_cxx11_(&local_4f0,this,*local_550);
          std::operator+(&local_510,&local_4f0,"_as_");
          EscapeKeyword(&local_230,this,&ev->name);
          std::operator+(&local_540,&local_510,&local_230);
          CodeWriter::SetValue(this_00,&local_588,&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,
                     "template<> inline {{U_FIELD_TYPE}}{{STRUCT_NAME}}::{{FIELD_NAME}}_as<{{U_ELEMENT_NAME}}>() const {"
                     ,(allocator<char> *)&local_588);
          CodeWriter::operator+=(this_00,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"  return {{U_FIELD_NAME}}();",
                     (allocator<char> *)&local_588);
          CodeWriter::operator+=(this_00,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f0,"}",(allocator<char> *)&local_588);
          CodeWriter::operator+=(this_00,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,"",(allocator<char> *)&local_588);
          CodeWriter::operator+=(this_00,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&nfn);
          ppEVar3 = local_518;
        }
      }
    }
    ppFVar2 = local_550 + 1;
  }
  GenBuilders(this,local_558);
  if ((this->opts_).super_IDLOptions.generate_object_based_api != false) {
    TableCreateSignature_abi_cxx11_(&nfn,this,pSVar1,true,local_560);
    std::operator+(&local_4b0,&nfn,";");
    CodeWriter::operator+=(this_00,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&nfn);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"",(allocator<char> *)&nfn);
    CodeWriter::operator+=(this_00,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
  }
  return;
}

Assistant:

void GenTable(const StructDef &struct_def) {
    if (opts_.generate_object_based_api) { GenNativeTable(struct_def); }

    // Generate an accessor struct, with methods of the form:
    // type name() const { return GetField<type>(offset, defaultval); }
    GenComment(struct_def.doc_comment);

    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_ +=
        "struct {{STRUCT_NAME}} FLATBUFFERS_FINAL_CLASS"
        " : private ::flatbuffers::Table {";
    if (opts_.generate_object_based_api) {
      code_ += "  typedef {{NATIVE_NAME}} NativeTableType;";
    }
    code_ += "  typedef {{STRUCT_NAME}}Builder Builder;";
    GenBinarySchemaTypeDef(parser_.root_struct_def_);

    if (opts_.g_cpp_std >= cpp::CPP_STD_17) { code_ += "  struct Traits;"; }
    if (opts_.mini_reflect != IDLOptions::kNone) {
      code_ +=
          "  static const ::flatbuffers::TypeTable *MiniReflectTypeTable() {";
      code_ += "    return {{STRUCT_NAME}}TypeTable();";
      code_ += "  }";
    }

    GenFullyQualifiedNameGetter(struct_def, Name(struct_def));

    // Generate field id constants.
    if (!struct_def.fields.vec.empty()) {
      // We need to add a trailing comma to all elements except the last one as
      // older versions of gcc complain about this.
      code_.SetValue("SEP", "");
      code_ +=
          "  enum FlatBuffersVTableOffset FLATBUFFERS_VTABLE_UNDERLYING_TYPE {";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) {
          // Deprecated fields won't be accessible.
          continue;
        }

        code_.SetValue("OFFSET_NAME", GenFieldOffsetName(*field));
        code_.SetValue("OFFSET_VALUE", NumToString(field->value.offset));
        code_ += "{{SEP}}    {{OFFSET_NAME}} = {{OFFSET_VALUE}}\\";
        code_.SetValue("SEP", ",\n");
      }
      code_ += "";
      code_ += "  };";
    }

    // Generate the accessors.
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }

      code_.SetValue("FIELD_NAME", Name(*field));
      GenTableFieldGetter(*field);
      if (opts_.mutable_buffer) { GenTableFieldSetter(*field); }

      auto nfn = GetNestedFlatBufferName(*field);
      if (!nfn.empty()) {
        code_.SetValue("CPP_NAME", nfn);
        code_ += "  const {{CPP_NAME}} *{{FIELD_NAME}}_nested_root() const {";
        code_ += "    const auto _f = {{FIELD_NAME}}();";
        code_ +=
            "    return _f ? ::flatbuffers::GetRoot<{{CPP_NAME}}>(_f->Data())";
        code_ += "              : nullptr;";
        code_ += "  }";
      }

      if (field->flexbuffer) {
        code_ +=
            "  flexbuffers::Reference {{FIELD_NAME}}_flexbuffer_root()"
            " const {";
        // Both Data() and size() are const-methods, therefore call order
        // doesn't matter.
        code_ += "    const auto _f = {{FIELD_NAME}}();";
        code_ += "    return _f ? flexbuffers::GetRoot(_f->Data(), _f->size())";
        code_ += "              : flexbuffers::Reference();";
        code_ += "  }";
      }

      // Generate a comparison function for this field if it is a key.
      if (field->key) { GenKeyFieldMethods(*field); }
    }

    if (opts_.cpp_static_reflection) { GenIndexBasedFieldGetter(struct_def); }

    // Generate a verifier function that can check a buffer from an untrusted
    // source will never cause reads outside the buffer.
    code_ += "  bool Verify(::flatbuffers::Verifier &verifier) const {";
    code_ += "    return VerifyTableStart(verifier)\\";
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) { continue; }
      GenVerifyCall(*field, " &&\n           ");
    }

    code_ += " &&\n           verifier.EndTable();";
    code_ += "  }";

    if (opts_.generate_object_based_api) {
      // Generate the UnPack() pre declaration.
      code_ += "  " + TableUnPackSignature(struct_def, true, opts_) + ";";
      code_ += "  " + TableUnPackToSignature(struct_def, true, opts_) + ";";
      code_ += "  " + TablePackSignature(struct_def, true, opts_) + ";";
    }

    code_ += "};";  // End of table.
    code_ += "";

    // Explicit specializations for union accessors
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated || field->value.type.base_type != BASE_TYPE_UNION) {
        continue;
      }

      auto u = field->value.type.enum_def;
      if (u->uses_multiple_type_instances) continue;

      code_.SetValue("FIELD_NAME", Name(*field));

      for (auto u_it = u->Vals().begin(); u_it != u->Vals().end(); ++u_it) {
        auto &ev = **u_it;
        if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }

        auto full_struct_name = GetUnionElement(ev, false, opts_);

        code_.SetValue(
            "U_ELEMENT_TYPE",
            WrapInNameSpace(u->defined_namespace, GetEnumValUse(*u, ev)));
        code_.SetValue("U_FIELD_TYPE", "const " + full_struct_name + " *");
        code_.SetValue("U_ELEMENT_NAME", full_struct_name);
        code_.SetValue("U_FIELD_NAME", Name(*field) + "_as_" + Name(ev));

        // `template<> const T *union_name_as<T>() const` accessor.
        code_ +=
            "template<> "
            "inline {{U_FIELD_TYPE}}{{STRUCT_NAME}}::{{FIELD_NAME}}_as"
            "<{{U_ELEMENT_NAME}}>() const {";
        code_ += "  return {{U_FIELD_NAME}}();";
        code_ += "}";
        code_ += "";
      }
    }

    GenBuilders(struct_def);

    if (opts_.generate_object_based_api) {
      // Generate a pre-declaration for a CreateX method that works with an
      // unpacked C++ object.
      code_ += TableCreateSignature(struct_def, true, opts_) + ";";
      code_ += "";
    }
  }